

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

CURLcode Curl_cpool_upkeep(void *data)

{
  curltime cVar1;
  time_t local_30;
  curltime now;
  cpool *cpool;
  void *data_local;
  
  now._8_8_ = cpool_get_instance((Curl_easy *)data);
  cVar1 = Curl_now();
  local_30 = cVar1.tv_sec;
  now.tv_sec._0_4_ = cVar1.tv_usec;
  if (now._8_8_ != 0) {
    if (now._8_8_ != 0) {
      if ((*(long *)(now._8_8_ + 0x88) != 0) &&
         ((*(uint *)(*(long *)(now._8_8_ + 0x88) + 4) & 0x20) != 0)) {
        Curl_share_lock(*(Curl_easy **)(now._8_8_ + 0x78),CURL_LOCK_DATA_CONNECT,
                        CURL_LOCK_ACCESS_SINGLE);
      }
      *(byte *)(now._8_8_ + 0x98) = *(byte *)(now._8_8_ + 0x98) & 0xfe | 1;
    }
    cpool_foreach((Curl_easy *)data,(cpool *)now._8_8_,&local_30,conn_upkeep);
    if (((now._8_8_ != 0) &&
        (*(byte *)(now._8_8_ + 0x98) = *(byte *)(now._8_8_ + 0x98) & 0xfe,
        *(long *)(now._8_8_ + 0x88) != 0)) &&
       ((*(uint *)(*(long *)(now._8_8_ + 0x88) + 4) & 0x20) != 0)) {
      Curl_share_unlock(*(Curl_easy **)(now._8_8_ + 0x78),CURL_LOCK_DATA_CONNECT);
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_cpool_upkeep(void *data)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct curltime now = Curl_now();

  if(!cpool)
    return CURLE_OK;

  CPOOL_LOCK(cpool);
  cpool_foreach(data, cpool, &now, conn_upkeep);
  CPOOL_UNLOCK(cpool);
  return CURLE_OK;
}